

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllipsoidRecord1.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::EllipsoidRecord1::EllipsoidRecord1
          (EllipsoidRecord1 *this,KUINT8 Index,WorldCoordinates *CentroidLocation,Vector *Sigma,
          EulerAngles *Orientation)

{
  KFLOAT64 KVar1;
  KFLOAT32 KVar2;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__EllipsoidRecord1_00226990;
  (this->m_CentLocation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002181e8;
  KVar1 = CentroidLocation->m_f64Y;
  (this->m_CentLocation).m_f64X = CentroidLocation->m_f64X;
  (this->m_CentLocation).m_f64Y = KVar1;
  (this->m_CentLocation).m_f64Z = CentroidLocation->m_f64Z;
  (this->m_Sigma).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00218190;
  KVar2 = Sigma->m_f32Y;
  (this->m_Sigma).m_f32X = Sigma->m_f32X;
  (this->m_Sigma).m_f32Y = KVar2;
  (this->m_Sigma).m_f32Z = Sigma->m_f32Z;
  (this->m_Ori).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_00217cc8;
  KVar2 = Orientation->m_f32Theta;
  (this->m_Ori).m_f32Psi = Orientation->m_f32Psi;
  (this->m_Ori).m_f32Theta = KVar2;
  (this->m_Ori).m_f32Phi = Orientation->m_f32Phi;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x100000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x180;
  return;
}

Assistant:

EllipsoidRecord1::EllipsoidRecord1( KUINT8 Index, const WorldCoordinates & CentroidLocation,
                                    const Vector & Sigma, const EulerAngles & Orientation ) :
    m_CentLocation( CentroidLocation ),
    m_Sigma( Sigma ),
    m_Ori( Orientation )
{
    m_ui32EnvRecTyp = EllipsoidRecord1Type;
    m_ui16Length = ( ELIPSOID_RECORD_1_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}